

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void cmDocumentation::WarnFormFromFilename(RequestedHelpItem *request,bool *result)

{
  bool bVar1;
  string ext;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::GetFilenameLastExtension(&local_40,&request->Filename);
  cmsys::SystemTools::UpperCase(&local_60,&local_40);
  std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator==(&local_40,".HTM");
  if (bVar1) {
LAB_0014cbb0:
    request->HelpType = None;
    *result = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Warning: HTML help format no longer supported",&local_61);
    cmSystemTools::Message(&local_60,(char *)0x0);
  }
  else {
    bVar1 = std::operator==(&local_40,".HTML");
    if (bVar1) goto LAB_0014cbb0;
    bVar1 = std::operator==(&local_40,".DOCBOOK");
    if (bVar1) {
      request->HelpType = None;
      *result = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Warning: Docbook help format no longer supported",&local_61);
      cmSystemTools::Message(&local_60,(char *)0x0);
    }
    else {
      if ((local_40._M_string_length != 2) || (8 < (byte)(local_40._M_dataplus._M_p[1] - 0x31U)))
      goto LAB_0014cbe3;
      request->HelpType = None;
      *result = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Warning: Man help format no longer supported",&local_61);
      cmSystemTools::Message(&local_60,(char *)0x0);
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
LAB_0014cbe3:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmDocumentation::WarnFormFromFilename(
  cmDocumentation::RequestedHelpItem& request, bool& result)
{
  std::string ext = cmSystemTools::GetFilenameLastExtension(request.Filename);
  ext = cmSystemTools::UpperCase(ext);
  if ((ext == ".HTM") || (ext == ".HTML")) {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: HTML help format no longer supported");
  } else if (ext == ".DOCBOOK") {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Docbook help format no longer supported");
  }
  // ".1" to ".9" should be manpages
  else if ((ext.length() == 2) && (ext[1] >= '1') && (ext[1] <= '9')) {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Man help format no longer supported");
  }
}